

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

vector3 * vector3_multiplym4(vector3 *self,matrix4 *mT)

{
  vector3 vR;
  anon_union_12_3_07544b15_for_vector3_0 local_1c;
  
  local_1c._0_8_ = 0;
  local_1c.v[2] = 0.0;
  matrix4_multiplyv3(mT,self,(vector3 *)&local_1c.field_1);
  (self->field_0).v[0] = local_1c.v[0];
  (self->field_0).v[1] = local_1c.v[1];
  (self->field_0).v[2] = local_1c.v[2];
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_multiplym4(struct vector3 *self, const struct matrix4 *mT)
{
	struct vector3 vR;

	vector3_zero(&vR);

	matrix4_multiplyv3(mT, self, &vR);

	vector3_set(self, &vR);

	return self;
}